

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall ClipperLib::Clipper::IsContributing(Clipper *this,TEdge *edge)

{
  cInt cVar1;
  PolyFillType local_28;
  PolyFillType local_24;
  PolyFillType pft2;
  PolyFillType pft;
  TEdge *edge_local;
  Clipper *this_local;
  
  if (edge->PolyTyp == ptSubject) {
    local_24 = this->m_SubjFillType;
    local_28 = this->m_ClipFillType;
  }
  else {
    local_24 = this->m_ClipFillType;
    local_28 = this->m_SubjFillType;
  }
  if (local_24 == pftEvenOdd) {
    if ((edge->WindDelta == 0) && (edge->WindCnt != 1)) {
      return false;
    }
  }
  else if (local_24 == pftNonZero) {
    cVar1 = Abs((long)edge->WindCnt);
    if (cVar1 != 1) {
      return false;
    }
  }
  else if (local_24 == pftPositive) {
    if (edge->WindCnt != 1) {
      return false;
    }
  }
  else if (edge->WindCnt != -1) {
    return false;
  }
  switch(this->m_ClipType) {
  case ctIntersection:
    if (local_28 < pftPositive) {
      this_local._7_1_ = edge->WindCnt2 != 0;
    }
    else if (local_28 == pftPositive) {
      this_local._7_1_ = 0 < edge->WindCnt2;
    }
    else {
      this_local._7_1_ = edge->WindCnt2 < 0;
    }
    break;
  case ctUnion:
    if (local_28 < pftPositive) {
      this_local._7_1_ = edge->WindCnt2 == 0;
    }
    else if (local_28 == pftPositive) {
      this_local._7_1_ = edge->WindCnt2 < 1;
    }
    else {
      this_local._7_1_ = -1 < edge->WindCnt2;
    }
    break;
  case ctDifference:
    if (edge->PolyTyp == ptSubject) {
      if (local_28 < pftPositive) {
        this_local._7_1_ = edge->WindCnt2 == 0;
      }
      else if (local_28 == pftPositive) {
        this_local._7_1_ = edge->WindCnt2 < 1;
      }
      else {
        this_local._7_1_ = -1 < edge->WindCnt2;
      }
    }
    else if (local_28 < pftPositive) {
      this_local._7_1_ = edge->WindCnt2 != 0;
    }
    else if (local_28 == pftPositive) {
      this_local._7_1_ = 0 < edge->WindCnt2;
    }
    else {
      this_local._7_1_ = edge->WindCnt2 < 0;
    }
    break;
  case ctXor:
    if (edge->WindDelta == 0) {
      if (local_28 < pftPositive) {
        this_local._7_1_ = edge->WindCnt2 == 0;
      }
      else if (local_28 == pftPositive) {
        this_local._7_1_ = edge->WindCnt2 < 1;
      }
      else {
        this_local._7_1_ = -1 < edge->WindCnt2;
      }
    }
    else {
      this_local._7_1_ = true;
    }
    break;
  default:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Clipper::IsContributing(const TEdge& edge) const
{
  PolyFillType pft, pft2;
  if (edge.PolyTyp == ptSubject)
  {
    pft = m_SubjFillType;
    pft2 = m_ClipFillType;
  } else
  {
    pft = m_ClipFillType;
    pft2 = m_SubjFillType;
  }

  switch(pft)
  {
    case pftEvenOdd: 
      //return false if a subj line has been flagged as inside a subj polygon
      if (edge.WindDelta == 0 && edge.WindCnt != 1) return false;
      break;
    case pftNonZero:
      if (Abs(edge.WindCnt) != 1) return false;
      break;
    case pftPositive: 
      if (edge.WindCnt != 1) return false;
      break;
    default: //pftNegative
      if (edge.WindCnt != -1) return false;
  }

  switch(m_ClipType)
  {
    case ctIntersection:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.WindCnt2 != 0);
        case pftPositive: 
          return (edge.WindCnt2 > 0);
        default: 
          return (edge.WindCnt2 < 0);
      }
      break;
    case ctUnion:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.WindCnt2 == 0);
        case pftPositive: 
          return (edge.WindCnt2 <= 0);
        default: 
          return (edge.WindCnt2 >= 0);
      }
      break;
    case ctDifference:
      if (edge.PolyTyp == ptSubject)
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.WindCnt2 == 0);
          case pftPositive: 
            return (edge.WindCnt2 <= 0);
          default: 
            return (edge.WindCnt2 >= 0);
        }
      else
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.WindCnt2 != 0);
          case pftPositive: 
            return (edge.WindCnt2 > 0);
          default: 
            return (edge.WindCnt2 < 0);
        }
      break;
    case ctXor:
      if (edge.WindDelta == 0) //XOr always contributing unless open
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.WindCnt2 == 0);
          case pftPositive: 
            return (edge.WindCnt2 <= 0);
          default: 
            return (edge.WindCnt2 >= 0);
        }
      else 
        return true;
      break;
    default:
      return true;
  }
}